

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O2

void on_data_first(intptr_t sockfd,fio_protocol_s *ws_)

{
  _func_uint8_t_intptr_t_fio_protocol_s_ptr *p_Var1;
  
  if (ws_[1].ping != (_func_void_intptr_t_fio_protocol_s_ptr *)0x0) {
    (*ws_[1].ping)((intptr_t)ws_,ws_);
  }
  ws_->on_data = on_data;
  ws_->on_ready = on_ready;
  if (ws_[3].on_shutdown != (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0) {
    p_Var1 = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)
             websocket_consume(ws_[3].on_data,(uint64_t)ws_[3].on_shutdown,ws_,
                               ~*(byte *)((long)&ws_[3].ping + 1) & 1);
    ws_[3].on_shutdown = p_Var1;
  }
  fio_force_event(sockfd,FIO_EVENT_ON_DATA);
  fio_force_event(sockfd,FIO_EVENT_ON_READY);
  return;
}

Assistant:

static void on_data_first(intptr_t sockfd, fio_protocol_s *ws_) {
  ws_s *const ws = (ws_s *)ws_;
  if (ws->on_open)
    ws->on_open(ws);
  ws->protocol.on_data = on_data;
  ws->protocol.on_ready = on_ready;

  if (ws->length) {
    ws->length = websocket_consume(ws->buffer.data, ws->length, ws,
                                   (~(ws->is_client) & 1));
  }
  fio_force_event(sockfd, FIO_EVENT_ON_DATA);
  fio_force_event(sockfd, FIO_EVENT_ON_READY);
}